

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_dynlight.cpp
# Opt level: O3

void __thiscall
ADynamicLight::CollectWithinRadius
          (ADynamicLight *this,DVector3 *pos,subsector_t *subSec,float radius)

{
  FDisplacement *pFVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  seg_t *psVar5;
  void *linkto;
  long lVar6;
  double *pdVar7;
  line_t *plVar8;
  FLightNode *pFVar9;
  subsector_t *psVar10;
  ulong uVar11;
  sector_t *linkto_00;
  long lVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  ADynamicLight *this_00;
  double dVar17;
  double dVar18;
  undefined1 local_48 [16];
  double local_38;
  
  if (subSec != (subsector_t *)0x0) {
    subSec->validcount = validcount;
    this_00 = (ADynamicLight *)&subSec->lighthead;
    pFVar9 = AddLightNode((FLightNode **)this_00,subSec,this,&this->touching_subsectors);
    this->touching_subsectors = pFVar9;
    linkto_00 = subSec->sector;
    if (linkto_00->validcount != validcount) {
      this_00 = (ADynamicLight *)&subSec->render_sector->lighthead;
      pFVar9 = AddLightNode((FLightNode **)this_00,linkto_00,this,&this->touching_sector);
      this->touching_sector = pFVar9;
      linkto_00 = subSec->sector;
      linkto_00->validcount = validcount;
    }
    if (subSec->numlines != 0) {
      lVar12 = 0;
      uVar11 = 0;
      do {
        psVar5 = subSec->firstline;
        dVar17 = DistToSeg(this_00,pos,(seg_t *)((long)&psVar5->v1 + lVar12));
        if (dVar17 <= (double)radius) {
          linkto = *(void **)((long)&psVar5->sidedef + lVar12);
          if ((((linkto != (void *)0x0) &&
               (lVar6 = *(long *)((long)&psVar5->linedef + lVar12), lVar6 != 0)) &&
              (*(int *)(lVar6 + 0x88) != validcount)) &&
             (pdVar7 = *(double **)((long)&psVar5->v1 + lVar12),
             this_00 = *(ADynamicLight **)((long)&psVar5->v2 + lVar12), dVar17 = *pdVar7,
             dVar18 = pdVar7[1],
             ((double)(this_00->super_AActor).super_DThinker.super_DObject.Class - dVar18) *
             (dVar17 - pos->X) +
             ((double)(this_00->super_AActor).super_DThinker.super_DObject._vptr_DObject - dVar17) *
             (pos->Y - dVar18) <= 0.0)) {
            *(int *)(lVar6 + 0x88) = validcount;
            this_00 = (ADynamicLight *)((long)linkto + 0xc0);
            pFVar9 = AddLightNode((FLightNode **)this_00,linkto,this,&this->touching_sides);
            this->touching_sides = pFVar9;
          }
          lVar6 = *(long *)((long)&psVar5->linedef + lVar12);
          if (lVar6 != 0) {
            uVar2 = *(uint *)(lVar6 + 0x90);
            if (((linePortals.Array != (FLinePortal *)0x0 && uVar2 < linePortals.Count) &&
                (linePortals.Array[uVar2].mType == '\x03')) &&
               (plVar8 = linePortals.Array[uVar2].mDestination, plVar8->validcount != validcount)) {
              this_00 = (ADynamicLight *)
                        ((plVar8->v1->p).X + 103079215104.0 + (plVar8->delta).X * 0.5);
              psVar10 = R_PointInSubsector((fixed_t)this_00,
                                           SUB84((plVar8->v1->p).Y + 103079215104.0 +
                                                 (plVar8->delta).Y * 0.5,0));
              if (psVar10->validcount != validcount) {
                iVar3 = ((this->super_AActor).Sector)->PortalGroup;
                iVar4 = plVar8->frontsector->PortalGroup;
                uVar13 = 0;
                uVar14 = 0;
                uVar15 = 0;
                uVar16 = 0;
                if (iVar3 != iVar4) {
                  pFVar1 = Displacements.data.Array + (iVar4 * Displacements.size + iVar3);
                  uVar13 = *(undefined4 *)&(pFVar1->pos).X;
                  uVar14 = *(undefined4 *)((long)&(pFVar1->pos).X + 4);
                  uVar15 = *(undefined4 *)&(pFVar1->pos).Y;
                  uVar16 = *(undefined4 *)((long)&(pFVar1->pos).Y + 4);
                }
                dVar17 = (this->super_AActor).__Pos.Y + (double)CONCAT44(uVar16,uVar15);
                local_38 = (this->super_AActor).__Pos.Z;
                local_48._8_4_ = SUB84(dVar17,0);
                local_48._0_8_ = (this->super_AActor).__Pos.X + (double)CONCAT44(uVar14,uVar13);
                local_48._12_4_ = (int)((ulong)dVar17 >> 0x20);
                this_00 = this;
                CollectWithinRadius(this,(DVector3 *)local_48,psVar10,radius);
              }
            }
          }
          lVar6 = *(long *)((long)&psVar5->PartnerSeg + lVar12);
          if (((lVar6 != 0) &&
              (psVar10 = *(subsector_t **)(lVar6 + 0x38), psVar10 != (subsector_t *)0x0)) &&
             (psVar10->validcount != validcount)) {
            this_00 = this;
            CollectWithinRadius(this,pos,psVar10,radius);
          }
        }
        uVar11 = uVar11 + 1;
        lVar12 = lVar12 + 0x48;
      } while (uVar11 < subSec->numlines);
      linkto_00 = subSec->sector;
    }
    if ((linkto_00->planes[1].Flags & 0x1d8U) == 0x100) {
      uVar2 = linkto_00->Portals[1];
      dVar17 = (double)radius + (this->super_AActor).__Pos.Z;
      if (sectorPortals.Array[uVar2].mPlaneZ <= dVar17 &&
          dVar17 != sectorPortals.Array[uVar2].mPlaneZ) {
        plVar8 = subSec->firstline->linedef;
        psVar10 = R_PointInSubsector(SUB84((plVar8->v1->p).X + 103079215104.0 +
                                           (plVar8->delta).X * 0.5 +
                                           sectorPortals.Array[uVar2].mDisplacement.X,0),
                                     SUB84((plVar8->v1->p).Y + 103079215104.0 +
                                           (plVar8->delta).Y * 0.5 +
                                           sectorPortals.Array[uVar2].mDisplacement.Y,0));
        if (psVar10->validcount != validcount) {
          local_38 = (this->super_AActor).__Pos.Z;
          iVar3 = ((this->super_AActor).Sector)->PortalGroup;
          iVar4 = psVar10->sector->PortalGroup;
          dVar17 = 0.0;
          dVar18 = 0.0;
          if (iVar3 != iVar4) {
            dVar17 = Displacements.data.Array[iVar4 * Displacements.size + iVar3].pos.X;
            dVar18 = Displacements.data.Array[iVar4 * Displacements.size + iVar3].pos.Y;
          }
          local_48._8_8_ = dVar18 + (this->super_AActor).__Pos.Y;
          local_48._0_8_ = dVar17 + (this->super_AActor).__Pos.X;
          CollectWithinRadius(this,(DVector3 *)local_48,psVar10,radius);
        }
      }
    }
    if ((linkto_00->planes[0].Flags & 0x1d8U) == 0x100) {
      uVar2 = linkto_00->Portals[0];
      if ((this->super_AActor).__Pos.Z - (double)radius < sectorPortals.Array[uVar2].mPlaneZ) {
        plVar8 = subSec->firstline->linedef;
        psVar10 = R_PointInSubsector(SUB84((plVar8->v1->p).X + 103079215104.0 +
                                           (plVar8->delta).X * 0.5 +
                                           sectorPortals.Array[uVar2].mDisplacement.X,0),
                                     SUB84((plVar8->v1->p).Y + 103079215104.0 +
                                           (plVar8->delta).Y * 0.5 +
                                           sectorPortals.Array[uVar2].mDisplacement.Y,0));
        if (psVar10->validcount != validcount) {
          local_38 = (this->super_AActor).__Pos.Z;
          iVar3 = ((this->super_AActor).Sector)->PortalGroup;
          iVar4 = psVar10->sector->PortalGroup;
          dVar17 = 0.0;
          dVar18 = 0.0;
          if (iVar3 != iVar4) {
            dVar17 = Displacements.data.Array[iVar4 * Displacements.size + iVar3].pos.X;
            dVar18 = Displacements.data.Array[iVar4 * Displacements.size + iVar3].pos.Y;
          }
          local_48._8_8_ = dVar18 + (this->super_AActor).__Pos.Y;
          local_48._0_8_ = dVar17 + (this->super_AActor).__Pos.X;
          CollectWithinRadius(this,(DVector3 *)local_48,psVar10,radius);
        }
      }
    }
  }
  return;
}

Assistant:

void ADynamicLight::CollectWithinRadius(const DVector3 &pos, subsector_t *subSec, float radius)
{
	if (!subSec) return;

	subSec->validcount = ::validcount;

	touching_subsectors = AddLightNode(&subSec->lighthead, subSec, this, touching_subsectors);
	if (subSec->sector->validcount != ::validcount)
	{
		touching_sector = AddLightNode(&subSec->render_sector->lighthead, subSec->sector, this, touching_sector);
		subSec->sector->validcount = ::validcount;
	}

	for (unsigned int i = 0; i < subSec->numlines; i++)
	{
		seg_t * seg = subSec->firstline + i;

		// check distance from x/y to seg and if within radius add this seg and, if present the opposing subsector (lather/rinse/repeat)
		// If out of range we do not need to bother with this seg.
		if (DistToSeg(pos, seg) <= radius)
		{
			if (seg->sidedef && seg->linedef && seg->linedef->validcount != ::validcount)
			{
				// light is in front of the seg
				if ((pos.Y - seg->v1->fY()) * (seg->v2->fX() - seg->v1->fX()) + (seg->v1->fX() - pos.X) * (seg->v2->fY() - seg->v1->fY()) <= 0)
				{
					seg->linedef->validcount = validcount;
					touching_sides = AddLightNode(&seg->sidedef->lighthead, seg->sidedef, this, touching_sides);
				}
			}
			if (seg->linedef)
			{
				FLinePortal *port = seg->linedef->getPortal();
				if (port && port->mType == PORTT_LINKED)
				{
					line_t *other = port->mDestination;
					if (other->validcount != ::validcount)
					{
						subsector_t *othersub = R_PointInSubsector(other->v1->fPos() + other->Delta() / 2);
						if (othersub->validcount != ::validcount) CollectWithinRadius(PosRelative(other), othersub, radius);
					}
				}
			}

			seg_t *partner = seg->PartnerSeg;
			if (partner)
			{
				subsector_t *sub = partner->Subsector;
				if (sub != NULL && sub->validcount != ::validcount)
				{
					CollectWithinRadius(pos, sub, radius);
				}
			}
		}
	}
	sector_t *sec = subSec->sector;
	if (!sec->PortalBlocksSight(sector_t::ceiling))
	{
		line_t *other = subSec->firstline->linedef;
		if (sec->GetPortalPlaneZ(sector_t::ceiling) < Z() + radius)
		{
			DVector2 refpos = other->v1->fPos() + other->Delta() / 2 + sec->GetPortalDisplacement(sector_t::ceiling);
			subsector_t *othersub = R_PointInSubsector(refpos);
			if (othersub->validcount != ::validcount) CollectWithinRadius(PosRelative(othersub->sector), othersub, radius);
		}
	}
	if (!sec->PortalBlocksSight(sector_t::floor))
	{
		line_t *other = subSec->firstline->linedef;
		if (sec->GetPortalPlaneZ(sector_t::floor) > Z() - radius)
		{
			DVector2 refpos = other->v1->fPos() + other->Delta() / 2 + sec->GetPortalDisplacement(sector_t::floor);
			subsector_t *othersub = R_PointInSubsector(refpos);
			if (othersub->validcount != ::validcount) CollectWithinRadius(PosRelative(othersub->sector), othersub, radius);
		}
	}
}